

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_mesh_builder.cxx
# Opt level: O3

void __thiscall xray_re::xr_mesh_builder::remove_duplicate_faces(xr_mesh_builder *this)

{
  uint uVar1;
  uint uVar2;
  pointer pbVar3;
  long lVar4;
  bool bVar5;
  long lVar6;
  __normal_iterator<xray_re::xr_mesh_builder::b_face_*,_std::vector<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>_>
  _Var7;
  pointer pbVar8;
  pointer this_00;
  
  generate_vertex_faces(this);
  this_00 = (this->m_faces).
            super__Vector_base<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pbVar8 = (this->m_faces).
           super__Vector_base<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (this_00 != pbVar8) {
    do {
      uVar1 = (this_00->field_0).field_0.v[0];
      uVar2 = (this->m_vertex_faces).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar1];
      if (uVar2 != 0xffffffff) {
        pbVar3 = (this->m_faces).
                 super__Vector_base<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        do {
          if ((this_00 < pbVar3 + uVar2) &&
             (bVar5 = b_face::is_duplicate(this_00,pbVar3 + uVar2), bVar5)) {
            (this_00->field_1).field_1.surf_idx = 0xffffffff;
            break;
          }
          lVar4 = 0;
          do {
            lVar6 = lVar4;
            if (lVar6 == -3) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_mesh_builder.h"
                            ,0xa4,
                            "uint32_t xray_re::xr_mesh_builder::b_face::next_face_idx(uint_fast32_t) const"
                           );
            }
            lVar4 = lVar6 + -1;
          } while (*(uint *)((long)&pbVar3[uVar2].field_0 + lVar6 * 4 + 8) != uVar1);
          uVar2 = *(uint *)((long)&pbVar3[uVar2].field_0 + lVar6 * 4 + 0x2c);
        } while (uVar2 != 0xffffffff);
      }
      this_00 = this_00 + 1;
    } while (this_00 != pbVar8);
    this_00 = (this->m_faces).
              super__Vector_base<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pbVar8 = (this->m_faces).
             super__Vector_base<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  _Var7 = std::
          __remove_if<__gnu_cxx::__normal_iterator<xray_re::xr_mesh_builder::b_face*,std::vector<xray_re::xr_mesh_builder::b_face,std::allocator<xray_re::xr_mesh_builder::b_face>>>,__gnu_cxx::__ops::_Iter_pred<bad_face_pred>>
                    (this_00,pbVar8);
  if (_Var7._M_current !=
      (this->m_faces).
      super__Vector_base<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    (this->m_faces).
    super__Vector_base<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>
    ._M_impl.super__Vector_impl_data._M_finish = _Var7._M_current;
  }
  return;
}

Assistant:

void xr_mesh_builder::remove_duplicate_faces()
{
	generate_vertex_faces();
	for (b_face_vec_it it = m_faces.begin(), end = m_faces.end(); it != end; ++it) {
		for (uint_fast32_t next = m_vertex_faces[it->v0]; next != BAD_IDX;) {
			b_face* face = &m_faces[next];
			if (face > &*it && it->is_duplicate(*face)) {
				it->surf_idx = BAD_IDX;
				goto skip;
			}
			next = face->next_face_idx(it->v0);
		}
skip:;
	}
	m_faces.erase(std::remove_if(m_faces.begin(), m_faces.end(), bad_face_pred()), m_faces.end());
}